

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

int __thiscall ON_BoundingBox::IsVisible(ON_BoundingBox *this,ON_Xform *bbox2c)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  bVar2 = ON_IsValid((this->m_min).x);
  iVar5 = 0;
  if ((bVar2) && (bVar2 = ON_IsValid((this->m_max).x), iVar5 = 0, bVar2)) {
    dVar11 = (this->m_min).x;
    dVar1 = (this->m_max).x;
    if (dVar11 <= dVar1) {
      bVar3 = 0xff;
      bVar4 = 0;
      iVar5 = 1;
      do {
        iVar6 = 1;
        dVar13 = (this->m_min).y;
        do {
          iVar7 = -2;
          dVar14 = (this->m_min).z;
          do {
            dVar9 = dVar14 * bbox2c->m_xform[3][2] +
                    dVar13 * bbox2c->m_xform[3][1] + dVar11 * bbox2c->m_xform[3][0] +
                    bbox2c->m_xform[3][3];
            dVar12 = dVar14 * bbox2c->m_xform[0][2] +
                     dVar13 * bbox2c->m_xform[0][1] + dVar11 * bbox2c->m_xform[0][0] +
                     bbox2c->m_xform[0][3];
            dVar10 = -dVar9;
            bVar8 = 1;
            if (dVar10 <= dVar12) {
              bVar8 = (dVar9 < dVar12) * '\x02';
            }
            dVar12 = dVar14 * bbox2c->m_xform[1][2] +
                     dVar13 * bbox2c->m_xform[1][1] + dVar11 * bbox2c->m_xform[1][0] +
                     bbox2c->m_xform[1][3];
            if (dVar10 <= dVar12) {
              if (dVar9 < dVar12) {
                bVar8 = bVar8 | 8;
              }
            }
            else {
              bVar8 = bVar8 | 4;
            }
            dVar14 = dVar14 * bbox2c->m_xform[2][2] +
                     dVar13 * bbox2c->m_xform[2][1] + dVar11 * bbox2c->m_xform[2][0] +
                     bbox2c->m_xform[2][3];
            if (dVar10 <= dVar14) {
              if (dVar9 < dVar14) {
                bVar8 = bVar8 | 0x20;
              }
            }
            else {
              bVar8 = bVar8 | 0x10;
            }
            bVar4 = bVar4 | bVar8;
            bVar3 = bVar3 & bVar8;
            if (bVar3 == 0 && bVar4 != 0) {
              return 1;
            }
            iVar7 = iVar7 + 1;
            dVar14 = (this->m_max).z;
          } while (iVar7 != 0);
          bVar2 = iVar6 != 0;
          iVar6 = iVar6 + -1;
          dVar13 = (this->m_max).y;
        } while (bVar2);
        bVar2 = iVar5 != 0;
        iVar5 = iVar5 + -1;
        dVar11 = dVar1;
      } while (bVar2);
      iVar5 = (uint)(bVar3 == 0) * 2;
    }
  }
  return iVar5;
}

Assistant:

int ON_BoundingBox::IsVisible( 
const ON_Xform& bbox2c
) const
{
int i,j,k,n;
unsigned int all_out, some_out, out;
double bx,by,bz,x,w;
const double* p;

  if ( !ON_IsValid(m_min.x) || !ON_IsValid(m_max.x) || m_min.x > m_max.x)
    return 0;

  some_out = 0;    // will be != 0 if some portion of box is outside visible region
  all_out  = 0xFFFFFFFF; // will be == 0 if some portion of box is inside visible region
  p = &bbox2c.m_xform[0][0];
  n = 0; 
  i = 2; bx = m_min.x;
  while(i--)
  {
    j = 2; by = m_min.y;
    while(j--)
    {
      k = 2; bz = m_min.z;
      while(k--)
      {
        w = bx*p[12] + by*p[13] + bz*p[14] + p[15];
        x = bx*p[ 0] + by*p[ 1] + bz*p[ 2] + p[ 3];
        if ( x < -w) out  = 0x01; else if (x > w) out  = 0x02; else out = 0;
        x = bx*p[ 4] + by*p[ 5] + bz*p[ 6] + p[ 7];
        if ( x < -w) out |= 0x04; else if (x > w) out |= 0x08;
        x = bx*p[ 8] + by*p[ 9] + bz*p[10] + p[11];
        if ( x < -w) out |= 0x10; else if (x > w) out |= 0x20;
        some_out |= out;
        all_out  &= out;
        if ( some_out && !all_out )
        {
          // box intersects visible region but is not completely inside it.
          return  1;
        }
        bz = m_max.z;
      }
      by = m_max.y;
    }
    bx = m_max.x;
  }

  return ( all_out ? 0 : 2 );
}